

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  ostream *poVar1;
  ostream *this_00;
  pthread_key_t *in_RDI;
  int gtest_error;
  int in_stack_0000004c;
  char *in_stack_00000050;
  GTestLogSeverity in_stack_0000005c;
  GTestLog *in_stack_00000060;
  void *in_stack_ffffffffffffffe0;
  GTestLog local_10;
  int local_c;
  
  pthread_getspecific(*in_RDI);
  DeleteThreadLocalValue(in_stack_ffffffffffffffe0);
  local_c = pthread_key_delete(*in_RDI);
  if (local_c != 0) {
    GTestLog::GTestLog(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_0000004c);
    poVar1 = GTestLog::GetStream(&local_10);
    poVar1 = std::operator<<(poVar1,"pthread_key_delete(key_)");
    this_00 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(this_00,local_c);
    GTestLog::~GTestLog((GTestLog *)poVar1);
  }
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }